

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

void arg_dstr_catf(arg_dstr_t ds,char *fmt,...)

{
  bool bVar1;
  char in_AL;
  uint uVar2;
  size_t sVar3;
  char *__s;
  undefined8 in_RCX;
  undefined8 in_RDX;
  uint uVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arglist;
  undefined8 local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if (fmt != (char *)0x0) {
    local_d8 = in_RDX;
    local_d0 = in_RCX;
    local_c8 = in_R8;
    local_c0 = in_R9;
    sVar3 = strlen(fmt);
    uVar2 = (int)sVar3 * 2;
    uVar4 = 0x10;
    if (0x10 < (int)uVar2) {
      uVar4 = uVar2;
    }
    __s = (char *)malloc((ulong)(uVar4 + 2));
    if (__s == (char *)0x0) {
      (*s_panic)("Out of memory!\n");
    }
    memset(__s,0,(ulong)(uVar4 + 2));
    local_108 = 0x3000000010;
    local_100 = &stack0x00000008;
    local_f8 = local_e8;
    uVar2 = vsnprintf(__s,(ulong)(uVar4 | 1),fmt,&local_108);
    sVar3 = strlen(__s);
    if (uVar4 <= sVar3) {
      do {
        bVar1 = (int)uVar4 < (int)uVar2;
        uVar4 = uVar4 * 2;
        if (bVar1) {
          uVar4 = uVar2;
        }
        free(__s);
        __s = (char *)malloc((long)(int)(uVar4 + 2));
        if (__s == (char *)0x0) {
          (*s_panic)("Out of memory!\n");
        }
        memset(__s,0,(long)(int)(uVar4 + 2));
        local_108 = 0x3000000010;
        local_100 = &stack0x00000008;
        local_f8 = local_e8;
        uVar2 = vsnprintf(__s,(long)(int)(uVar4 + 1),fmt,&local_108);
        sVar3 = strlen(__s);
      } while ((ulong)(long)(int)uVar4 <= sVar3);
    }
    arg_dstr_cat(ds,__s);
    free(__s);
  }
  return;
}

Assistant:

void arg_dstr_catf(arg_dstr_t ds, const char* fmt, ...) {
    va_list arglist;
    char* buff;
    int n, r;
    size_t slen;

    if (fmt == NULL)
        return;

    /* Since the length is not determinable beforehand, a search is
       performed using the truncating "vsnprintf" call (to avoid buffer
       overflows) on increasing potential sizes for the output result. */

    if ((n = (int)(2 * strlen(fmt))) < START_VSNBUFF)
        n = START_VSNBUFF;

    buff = (char*)xmalloc((size_t)(n + 2));
    memset(buff, 0, (size_t)(n + 2));

    for (;;) {
        va_start(arglist, fmt);
        r = vsnprintf(buff, (size_t)(n + 1), fmt, arglist);
        va_end(arglist);

        slen = strlen(buff);
        if (slen < (size_t)n)
            break;

        if (r > n)
            n = r;
        else
            n += n;

        xfree(buff);
        buff = (char*)xmalloc((size_t)(n + 2));
        memset(buff, 0, (size_t)(n + 2));
    }

    arg_dstr_cat(ds, buff);
    xfree(buff);
}